

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O2

uint64_t Hacl_Bignum64_eq_mask(uint32_t len,uint64_t *a,uint64_t *b)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = FStar_UInt64_eq_mask(a[uVar2],b[uVar2]);
    uVar3 = uVar3 & uVar1;
  }
  return uVar3;
}

Assistant:

uint64_t Hacl_Bignum64_eq_mask(uint32_t len, uint64_t *a, uint64_t *b)
{
  uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t uu____0 = FStar_UInt64_eq_mask(a[i], b[i]);
    mask = uu____0 & mask;
  }
  uint64_t mask1 = mask;
  return mask1;
}